

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selftest-sha512.c
# Opt level: O0

int main(void)

{
  int iVar1;
  int i;
  uint8_t checkhash [64];
  sha512 h;
  undefined4 in_stack_fffffffffffffee0;
  int iVar2;
  uint8_t *in_stack_fffffffffffffee8;
  sha512 *in_stack_fffffffffffffef0;
  sha512 local_d8;
  undefined4 local_4;
  
  local_4 = 0;
  iVar2 = 0;
  while( true ) {
    if (0x7f < iVar2) {
      return 0;
    }
    sha512_init(&local_d8);
    sha512_add(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
               CONCAT44(iVar2,in_stack_fffffffffffffee0));
    sha512_final(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    iVar1 = memcmp(&stack0xfffffffffffffee8,table[iVar2].hash,0x40);
    if (iVar1 != 0) break;
    iVar2 = iVar2 + 1;
  }
  fprintf(_stderr,"sha512-selftest: can\'t verify hash number %d\n",(ulong)(iVar2 + 1));
  return 1;
}

Assistant:

int main()
{
	struct sha512 h;
	uint8_t checkhash[SHA512_HASH_LENGTH];
	int i;

	for (i = 0; i < table_num; i++) {
		sha512_init(&h);
		sha512_add(&h, table[i].buffer, table[i].len);
		sha512_final(&h, checkhash);

		if (memcmp(checkhash, table[i].hash, SHA512_HASH_LENGTH) != 0) {
			fprintf(stderr, "sha512-selftest: can't verify hash number %d\n", i+1);
			return 1;
		}
	}

	return 0;
}